

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_encoder.c
# Opt level: O0

lzma_ret lzma_properties_encode(lzma_filter *filter,uint8_t *props)

{
  lzma_filter_encoder *plVar1;
  lzma_filter_encoder *fe;
  uint8_t *props_local;
  lzma_filter *filter_local;
  
  plVar1 = encoder_find(filter->id);
  if (plVar1 == (lzma_filter_encoder *)0x0) {
    filter_local._4_4_ = LZMA_PROG_ERROR;
  }
  else if (plVar1->props_encode == (_func_lzma_ret_void_ptr_uint8_t_ptr *)0x0) {
    filter_local._4_4_ = LZMA_OK;
  }
  else {
    filter_local._4_4_ = (*plVar1->props_encode)(filter->options,props);
  }
  return filter_local._4_4_;
}

Assistant:

extern LZMA_API(lzma_ret)
lzma_properties_encode(const lzma_filter *filter, uint8_t *props)
{
	const lzma_filter_encoder *const fe = encoder_find(filter->id);
	if (fe == NULL)
		return LZMA_PROG_ERROR;

	if (fe->props_encode == NULL)
		return LZMA_OK;

	return fe->props_encode(filter->options, props);
}